

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

bool __thiscall SimpleLoggerMgr::chkExitOnCrash(SimpleLoggerMgr *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  char *pcVar4;
  long in_RDI;
  char *env_segv;
  string env_segv_str;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  string local_30 [47];
  byte local_1;
  
  if ((*(byte *)(in_RDI + 0x429) & 1) != 0) {
    local_1 = 1;
    goto LAB_001952fe;
  }
  std::__cxx11::string::string(local_30);
  pcVar4 = getenv("SIMPLELOGGER_EXIT_ON_CRASH");
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::operator=(local_30,pcVar4);
  }
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffb7,
                                   CONCAT16(in_stack_ffffffffffffffb6,
                                            CONCAT15(in_stack_ffffffffffffffb5,
                                                     CONCAT14(in_stack_ffffffffffffffb4,
                                                              in_stack_ffffffffffffffb0)))),
                          in_stack_ffffffffffffffa8);
  if ((bool)uVar1) {
LAB_001952d8:
    local_1 = 1;
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                                    CONCAT15(in_stack_ffffffffffffffb5,
                                                             CONCAT14(in_stack_ffffffffffffffb4,
                                                                      in_stack_ffffffffffffffb0)))),
                            in_stack_ffffffffffffffa8);
    if ((bool)uVar2) goto LAB_001952d8;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffb5,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0)))),
                            in_stack_ffffffffffffffa8);
    if (bVar3) goto LAB_001952d8;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0)))),
                            in_stack_ffffffffffffffa8);
    if (bVar3) goto LAB_001952d8;
    local_1 = 0;
  }
  std::__cxx11::string::~string(local_30);
LAB_001952fe:
  return (bool)(local_1 & 1);
}

Assistant:

bool SimpleLoggerMgr::chkExitOnCrash() {
    if (exitOnCrash) return true;

    std::string env_segv_str;
    const char* env_segv = std::getenv("SIMPLELOGGER_EXIT_ON_CRASH");
    if (env_segv) env_segv_str = env_segv;

    if ( env_segv_str == "ON" ||
         env_segv_str == "on" ||
         env_segv_str == "TRUE" ||
         env_segv_str == "true" ) {
        // Manually turned off by user, via env var.
        return true;
    }

    return false;
}